

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O3

void __thiscall FString::StripLeftRight(FString *this)

{
  int iVar1;
  FStringData *pFVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  char *__src;
  
  __src = this->Chars;
  uVar3 = (ulong)*(uint *)(__src + -0xc);
  if (uVar3 == 0) {
    return;
  }
  uVar5 = 0;
  do {
    iVar1 = isspace((uint)(byte)__src[uVar5]);
    uVar6 = uVar5;
    if (iVar1 == 0) break;
    uVar5 = uVar5 + 1;
    uVar6 = uVar3;
  } while (uVar3 != uVar5);
  uVar3 = uVar3 - 1;
  if (uVar6 <= uVar3) {
    lVar7 = 0;
    do {
      iVar1 = isspace((uint)(byte)__src[uVar3]);
      if (iVar1 == 0) {
        if (lVar7 == 0 && uVar6 == 0) {
          return;
        }
        break;
      }
      uVar3 = uVar3 - 1;
      lVar7 = lVar7 + 1;
    } while (uVar6 <= uVar3);
  }
  if (*(int *)(__src + -4) < 2) {
    sVar4 = 0;
    if (uVar6 <= uVar3) {
      do {
        this->Chars[sVar4] = this->Chars[uVar6];
        uVar6 = uVar6 + 1;
        sVar4 = sVar4 + 1;
      } while (uVar6 <= uVar3);
      __src = this->Chars;
    }
    __src[sVar4] = '\0';
    ReallocBuffer(this,sVar4);
    return;
  }
  sVar4 = (uVar3 - uVar6) + 1;
  pFVar2 = FStringData::Alloc(sVar4);
  this->Chars = (char *)(pFVar2 + 1);
  pFVar2->Len = (uint)sVar4;
  memcpy(pFVar2 + 1,__src,sVar4);
  *(undefined1 *)((long)pFVar2 + (uVar3 - uVar6) + 0xd) = 0;
  FStringData::Release((FStringData *)(__src + -0xc));
  return;
}

Assistant:

FString &FString::operator += (const FString &tail)
{
	size_t len1 = Len();
	size_t len2 = tail.Len();
	ReallocBuffer (len1 + len2);
	StrCopy (Chars + len1, tail);
	return *this;
}